

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_cts.c
# Opt level: O0

size_t cts128_cs2_decrypt(PROV_CIPHER_CTX *ctx,uchar *in,uchar *out,size_t len)

{
  int iVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t in_stack_00000020;
  uchar *in_stack_00000028;
  uchar *in_stack_00000030;
  PROV_CIPHER_CTX *in_stack_00000038;
  size_t local_8;
  
  if ((in_RCX & 0xf) == 0) {
    iVar1 = (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RDX,in_RSI,in_RCX);
    local_8 = in_RCX;
    if (iVar1 == 0) {
      local_8 = 0;
    }
  }
  else {
    local_8 = cts128_cs3_decrypt(in_stack_00000038,in_stack_00000030,in_stack_00000028,
                                 in_stack_00000020);
  }
  return local_8;
}

Assistant:

static size_t cts128_cs2_decrypt(PROV_CIPHER_CTX *ctx, const unsigned char *in,
                                 unsigned char *out, size_t len)
{
    if (len % CTS_BLOCK_SIZE == 0) {
        /* If there are no partial blocks then it is the same as CBC mode */
        if (!ctx->hw->cipher(ctx, out, in, len))
            return 0;
        return len;
    }
    /* For partial blocks CS2 is equivalent to CS3 */
    return cts128_cs3_decrypt(ctx, in, out, len);
}